

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
               (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *slv,int k,bit_array *x)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long in_R10;
  undefined1 auVar7 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [64];
  undefined1 local_30 [16];
  undefined1 auVar8 [32];
  undefined1 auVar12 [32];
  
  sparse_matrix<int>::row((sparse_matrix<int> *)local_30,(int)slv + 0x10);
  if (local_30._8_8_ == local_30._0_8_) {
    iVar18 = 0;
  }
  else {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    auVar12._8_4_ = 0xffffffc0;
    auVar12._0_8_ = 0xffffffc0ffffffc0;
    auVar12._12_4_ = 0xffffffc0;
    auVar12._16_4_ = 0xffffffc0;
    auVar12._20_4_ = 0xffffffc0;
    auVar12._24_4_ = 0xffffffc0;
    auVar12._28_4_ = 0xffffffc0;
    auVar14 = vpbroadcastq_avx512f(ZEXT816(1));
    lVar5 = local_30._0_8_ - local_30._8_8_;
    uVar6 = 0;
    auVar15 = vpbroadcastq_avx512f();
    auVar15 = vpsrlq_avx512f(auVar15,3);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar16 = vpbroadcastq_avx512f();
      uVar6 = uVar6 + 8;
      auVar16 = vporq_avx512f(auVar16,auVar13);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar15,2);
      vpgatherdd_avx512vl(*(undefined4 *)(local_30._8_8_ + (long)slv));
      auVar8 = vpgatherdd_avx512vl(*(undefined4 *)
                                    ((long)&(slv->super_debug_logger<true>).ofs + local_30._8_8_ + 4
                                    ));
      bVar1 = (byte)uVar3;
      auVar9._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar8._4_4_;
      auVar9._0_4_ = (uint)(bVar1 & 1) * auVar8._0_4_;
      auVar9._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar8._8_4_;
      auVar9._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar8._12_4_;
      auVar9._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar8._16_4_;
      auVar9._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar8._20_4_;
      auVar9._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar8._24_4_;
      auVar9._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar8._28_4_;
      local_30._8_8_ = local_30._8_8_ + 0x40;
      auVar8 = vpsrad_avx2(auVar9,0x1f);
      auVar8 = vpsrld_avx2(auVar8,0x1a);
      auVar8 = vpaddd_avx2(auVar9,auVar8);
      vpsrad_avx2(auVar8,6);
      auVar8 = vpand_avx2(auVar8,auVar12);
      auVar16 = vpgatherdq_avx512f((int)(x->super_bit_array_impl).m_data._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                        [in_R10]);
      auVar17._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar16._8_8_;
      auVar17._0_8_ = (ulong)(bVar1 & 1) * auVar16._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar16._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar16._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar16._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar16._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar16._48_8_;
      auVar17._56_8_ = (uVar3 >> 7) * auVar16._56_8_;
      auVar8 = vpsubd_avx2(auVar9,auVar8);
      auVar16 = vpmovzxdq_avx512f(auVar8);
      auVar8 = vpgatherdd_avx512vl((slv->A)._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar6]);
      auVar10._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar8._4_4_;
      auVar10._0_4_ = (uint)(bVar1 & 1) * auVar8._0_4_;
      auVar10._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar8._8_4_;
      auVar10._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar8._12_4_;
      auVar10._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar8._16_4_;
      auVar10._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar8._20_4_;
      auVar10._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar8._24_4_;
      auVar10._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar8._28_4_;
      auVar16 = vpsrlvq_avx512f(auVar17,auVar16);
      uVar4 = vptestmq_avx512f(auVar16,auVar14);
      auVar8 = vpaddd_avx512vl(auVar26._0_32_,auVar10);
      bVar2 = (bool)((byte)uVar4 & 1);
      iVar18 = auVar26._0_4_;
      auVar11._0_4_ = (uint)bVar2 * auVar8._0_4_ | (uint)!bVar2 * iVar18;
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      iVar19 = auVar26._4_4_;
      auVar11._4_4_ = (uint)bVar2 * auVar8._4_4_ | (uint)!bVar2 * iVar19;
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      iVar20 = auVar26._8_4_;
      auVar11._8_4_ = (uint)bVar2 * auVar8._8_4_ | (uint)!bVar2 * iVar20;
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      iVar21 = auVar26._12_4_;
      auVar11._12_4_ = (uint)bVar2 * auVar8._12_4_ | (uint)!bVar2 * iVar21;
      bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
      iVar22 = auVar26._16_4_;
      auVar11._16_4_ = (uint)bVar2 * auVar8._16_4_ | (uint)!bVar2 * iVar22;
      bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
      iVar23 = auVar26._20_4_;
      auVar11._20_4_ = (uint)bVar2 * auVar8._20_4_ | (uint)!bVar2 * iVar23;
      bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
      iVar24 = auVar26._24_4_;
      auVar11._24_4_ = (uint)bVar2 * auVar8._24_4_ | (uint)!bVar2 * iVar24;
      bVar2 = SUB81(uVar4 >> 7,0);
      iVar25 = auVar26._28_4_;
      auVar11._28_4_ = (uint)bVar2 * auVar8._28_4_ | (uint)!bVar2 * iVar25;
      auVar26 = ZEXT3264(auVar11);
    } while (((lVar5 - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar6);
    auVar12 = vmovdqa32_avx512vl(auVar11);
    auVar7._0_4_ = (uint)(bVar1 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar1 & 1) * iVar18;
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar7._4_4_ = (uint)bVar2 * auVar12._4_4_ | (uint)!bVar2 * iVar19;
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar7._8_4_ = (uint)bVar2 * auVar12._8_4_ | (uint)!bVar2 * iVar20;
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar7._12_4_ = (uint)bVar2 * auVar12._12_4_ | (uint)!bVar2 * iVar21;
    bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar8._16_4_ = (uint)bVar2 * auVar12._16_4_ | (uint)!bVar2 * iVar22;
    auVar8._0_16_ = auVar7;
    bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar8._20_4_ = (uint)bVar2 * auVar12._20_4_ | (uint)!bVar2 * iVar23;
    bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar8._24_4_ = (uint)bVar2 * auVar12._24_4_ | (uint)!bVar2 * iVar24;
    bVar2 = SUB81(uVar3 >> 7,0);
    auVar8._28_4_ = (uint)bVar2 * auVar12._28_4_ | (uint)!bVar2 * iVar25;
    auVar7 = vphaddd_avx(auVar8._16_16_,auVar7);
    auVar7 = vphaddd_avx(auVar7,auVar7);
    auVar7 = vphaddd_avx(auVar7,auVar7);
    iVar18 = auVar7._0_4_;
  }
  return iVar18 == (slv->b)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
                   ._M_head_impl[k].value;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}